

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O2

void iSortDependencies(Abc_Ntk_t *pNtk,Vec_Int_t **iDep,int *oGroup)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  long lVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  int i;
  
  p = Vec_IntAlloc(10);
  for (lVar4 = 0; lVar4 < pNtk->vPis->nSize; lVar4 = lVar4 + 1) {
    if (iDep[lVar4]->nSize != 1) {
      p_00 = Vec_IntAlloc(iDep[lVar4]->nSize);
      for (iVar5 = 0; pVVar6 = iDep[lVar4], iVar5 < pVVar6->nSize; iVar5 = iVar5 + 1) {
        iVar1 = Vec_IntEntry(pVVar6,iVar5);
        Vec_IntPushUniqueOrder(p,oGroup[iVar1]);
      }
      iVar5 = p->nSize;
      iVar1 = 0;
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      for (; iVar1 != iVar5; iVar1 = iVar1 + 1) {
        for (i = 0; i < pVVar6->nSize; i = i + 1) {
          iVar2 = Vec_IntEntry(pVVar6,i);
          iVar2 = oGroup[iVar2];
          iVar3 = Vec_IntEntry(p,iVar1);
          if (iVar2 == iVar3) {
            iVar2 = Vec_IntEntry(iDep[lVar4],i);
            Vec_IntPush(p_00,iVar2);
            pVVar6 = iDep[lVar4];
            iVar2 = Vec_IntEntry(pVVar6,i);
            Vec_IntRemove(pVVar6,iVar2);
            i = i + -1;
          }
          pVVar6 = iDep[lVar4];
        }
      }
      Vec_IntFree(pVVar6);
      iDep[lVar4] = p_00;
      p->nSize = 0;
    }
  }
  Vec_IntFree(p);
  return;
}

Assistant:

void iSortDependencies(Abc_Ntk_t *pNtk, Vec_Int_t** iDep, int* oGroup)
{
    int i, j, k;    
    Vec_Int_t * temp;    
    Vec_Int_t * oGroupList;    

    oGroupList = Vec_IntAlloc( 10 );

    for(i = 0; i < Abc_NtkPiNum(pNtk); i++)
    {
        if(Vec_IntSize(iDep[i]) == 1)
            continue;
        
        temp = Vec_IntAlloc( Vec_IntSize(iDep[i]) );        

        for(j = 0; j < Vec_IntSize(iDep[i]); j++)
            Vec_IntPushUniqueOrder(oGroupList, oGroup[Vec_IntEntry(iDep[i], j)]);

        for(j = 0; j < Vec_IntSize(oGroupList); j++)
        {
            for(k = 0; k < Vec_IntSize(iDep[i]); k++)
                if(oGroup[Vec_IntEntry(iDep[i], k)] == Vec_IntEntry(oGroupList, j))
                {
                    Vec_IntPush( temp, Vec_IntEntry(iDep[i], k) );        
                    Vec_IntRemove( iDep[i], Vec_IntEntry(iDep[i], k) );
                    k--;
                }
        }        

        Vec_IntFree( iDep[i] );        
        iDep[i] = temp;
        Vec_IntClear( oGroupList );

        /*printf("Input %d: ", i);
        for(j = 0; j < Vec_IntSize(iDep[i]); j++)
            printf("%d ", Vec_IntEntry(iDep[i], j));
        printf("\n");*/
    }
    
    Vec_IntFree( oGroupList );
}